

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Session.cpp
# Opt level: O3

void __thiscall FIX::Session::generateHeartbeat(Session *this,Message *testRequest)

{
  FieldBase *field;
  Message heartbeat;
  long *local_1e8;
  long local_1e0;
  long local_1d8 [2];
  undefined1 local_1c8 [16];
  _Alloc_hider local_1b8;
  char local_1a8 [16];
  _Alloc_hider local_198;
  size_type local_190;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_188;
  field_metrics local_178;
  Message local_170;
  
  local_1e8 = local_1d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,&MsgType_Heartbeat,0x1cd8af);
  local_1c8._0_8_ = &PTR__FieldBase_001f55c8;
  local_1c8._8_4_ = 0x23;
  local_1b8._M_p = local_1a8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1b8,local_1e8,local_1e0 + (long)local_1e8);
  local_198._M_p = (pointer)&local_188;
  local_190 = 0;
  local_188._M_local_buf[0] = '\0';
  local_178.m_length = 0;
  local_178.m_checksum = 0;
  local_1c8._0_8_ = &PTR__FieldBase_001f6658;
  newMessage(&local_170,this,(MsgType *)local_1c8);
  FieldBase::~FieldBase((FieldBase *)local_1c8);
  if (local_1e8 != local_1d8) {
    operator_delete(local_1e8,local_1d8[0] + 1);
  }
  fill(this,&local_170.m_header);
  field = FieldMap::getFieldRef(&testRequest->super_FieldMap,0x70);
  FieldMap::setField(&local_170.super_FieldMap,field,true);
  sendRaw(this,&local_170,0);
  Message::~Message(&local_170);
  return;
}

Assistant:

void Session::generateHeartbeat(const Message &testRequest) {
  Message heartbeat = newMessage(MsgType(MsgType_Heartbeat));

  fill(heartbeat.getHeader());
  try {
    heartbeat.setField(testRequest.getField<TestReqID>());
  } catch (FieldNotFound &) {}

  sendRaw(heartbeat);
}